

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O2

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,TGAColor *colors)

{
  vec<3,_float,_(glm::qualifier)0> A;
  TinyRender *pTVar1;
  TGAColor *pTVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  int j;
  vec<3,_float,_(glm::qualifier)0> *this_00;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar8;
  undefined8 extraout_XMM0_Qb;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar9;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_XMM7_Da;
  vec<3,_float,_(glm::qualifier)0> P;
  Vec3f VVar10;
  TGAColor c;
  Vec2f bboxmax;
  TGAColor local_b1;
  float local_ac;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_a8;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_98;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_94;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_8c;
  undefined8 local_88;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_80;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_7c;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_78;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_74;
  TinyRender *local_70;
  TGAColor *local_68;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_60;
  float fStack_5c;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_58;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_54;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_50;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_4c;
  undefined1 local_48 [16];
  
  local_68 = colors;
  TGAImage::get_width(this->mImage);
  iVar3 = TGAImage::get_width(this->mImage);
  iVar4 = TGAImage::get_height(this->mImage);
  _local_98 = CONCAT44((float)(iVar4 + -1),(float)(iVar3 + -1));
  _local_78 = 0;
  iVar3 = TGAImage::get_width(this->mImage);
  local_70 = this;
  iVar4 = TGAImage::get_height(this->mImage);
  local_60.x = (float)(iVar3 + -1);
  fStack_5c = (float)(iVar4 + -1);
  for (local_88 = 0; pTVar2 = local_68, pTVar1 = local_70, local_88 != 3; local_88 = local_88 + 1) {
    this_00 = pts + local_88;
    for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
      pfVar5 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_98,iVar3);
      pfVar6 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_00,iVar3);
      local_a8.x = *pfVar6;
      if (*pfVar5 <= *pfVar6) {
        local_a8.x = *pfVar5;
      }
      if (local_a8.x <= 0.0) {
        local_a8 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
      }
      pfVar5 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_98,iVar3);
      *pfVar5 = (float)local_a8;
      pfVar5 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_60,iVar3);
      pfVar6 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_78,iVar3);
      pfVar7 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](this_00,iVar3);
      local_a8.x = *pfVar7;
      if (*pfVar7 <= *pfVar6) {
        local_a8.x = *pfVar6;
      }
      if (*pfVar5 <= local_a8.x) {
        local_a8.x = *pfVar5;
      }
      pfVar5 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                         ((vec<2,_float,_(glm::qualifier)0> *)&local_78,iVar3);
      *pfVar5 = (float)local_a8;
    }
  }
  uStack_a0 = 0;
  uStack_9c = 0;
  for (local_a8 = local_98; local_a8.x <= local_78.x; local_a8.x = local_a8.x + 1.0) {
    aStack_a4 = aStack_94;
    while (aStack_a4.y <= aStack_74.y) {
      local_88 = CONCAT44(aStack_a4,aStack_a4);
      A.field_0 = pts->field_0;
      A.field_1 = pts->field_1;
      A.field_2 = pts->field_2;
      P.field_1.y = aStack_a4.y;
      P.field_0.x = local_a8.x;
      P.field_2 = in_XMM7_Da;
      aStack_80 = aStack_a4;
      aStack_7c = aStack_a4;
      VVar10 = barycentric<3ul>(A,pts[1],pts[2],P);
      aVar9 = VVar10.field_2;
      aVar8 = VVar10.field_1;
      if (((0.0 <= VVar10.field_0.x) && (0.0 <= aVar8.y)) && (0.0 <= aVar9.z)) {
        local_ac = pts[2].field_2.z * aVar9.z +
                   (pts->field_2).z * VVar10.field_0.x + pts[1].field_2.z * aVar8.y;
        pfVar5 = pTVar1->mZBuffer;
        local_48._8_4_ = (int)extraout_XMM0_Qb;
        local_48._0_8_ = VVar10._0_8_;
        local_48._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
        local_8c = aVar9;
        local_58 = aVar8;
        aStack_54 = aVar8;
        aStack_50 = aVar8;
        aStack_4c = aVar8;
        iVar3 = TGAImage::get_width(pTVar1->mImage);
        if (local_ac < pfVar5[(int)((float)iVar3 * (float)local_88 + local_a8.x)] ||
            local_ac == pfVar5[(int)((float)iVar3 * (float)local_88 + local_a8.x)]) {
          pfVar5 = pTVar1->mZBuffer;
          iVar3 = TGAImage::get_width(pTVar1->mImage);
          pfVar5[(int)((float)iVar3 * (float)local_88 + local_a8.x)] = local_ac;
          TGAColor::TGAColor(&local_b1);
          local_b1.bgra[0] =
               (uchar)(int)((float)pTVar2[2].bgra[0] * local_8c.z +
                           (float)pTVar2->bgra[0] * (float)local_48._0_4_ +
                           (float)pTVar2[1].bgra[0] * local_58.y);
          local_b1.bgra[1] =
               (uchar)(int)((float)pTVar2[2].bgra[1] * local_8c.z +
                           (float)pTVar2->bgra[1] * (float)local_48._0_4_ +
                           (float)pTVar2[1].bgra[1] * local_58.y);
          local_b1.bgra[2] =
               (uchar)(int)((float)pTVar2[2].bgra[2] * local_8c.z +
                           (float)pTVar2->bgra[2] * (float)local_48._0_4_ +
                           (float)pTVar2[1].bgra[2] * local_58.y);
          TGAImage::set(pTVar1->mImage,(int)local_a8.x,(int)(float)local_88,&local_b1);
        }
      }
      aStack_a4.y = (float)local_88 + 1.0;
    }
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, TGAColor* colors) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;

      TGAColor c;
      /*
          barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];

      mImage->set(p[0], p[1], c);
    }
  }
}